

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# externals.c
# Opt level: O0

course_html_parts ucrcourse_get_html(course_query *query)

{
  course_html_parts cVar1;
  char *response_00;
  char *response;
  course_query *query_local;
  course_html_parts result;
  
  response_00 = ucrcourse_get_raw(query);
  if (response_00 == (char *)0x0) {
    query_local = (course_query *)0x0;
    result.listings = (char *)0x0;
  }
  else {
    extract_html(response_00,(char **)&query_local,&result.listings);
    free(response_00);
  }
  cVar1.details = result.listings;
  cVar1.listings = (char *)query_local;
  return cVar1;
}

Assistant:

struct course_html_parts ucrcourse_get_html(const struct course_query *query)
{
	struct course_html_parts result;
	char *response;

	response = ucrcourse_get_raw(query);
	if (!response) {
		result.listings = NULL;
		result.details = NULL;
		return result;
	}

	extract_html(response, &result.listings, &result.details);
	free(response);
	return result;
}